

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int vorbis_decode_packet(vorb *f,int *len,int *p_left,int *p_right)

{
  int iVar1;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *unaff_retaddr;
  vorb *in_stack_00000008;
  int right_end;
  int left_end;
  int mode;
  int in_stack_00000b4c;
  int in_stack_00000b50;
  int in_stack_00000b54;
  Mode *in_stack_00000b58;
  int *in_stack_00000b60;
  vorb *in_stack_00000b68;
  int in_stack_00000b80;
  int *in_stack_00000b88;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = vorbis_decode_initial
                    (in_stack_00000008,unaff_retaddr,
                     (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                     in_RSI,in_RDX);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = vorbis_decode_packet_rest
                      (in_stack_00000b68,in_stack_00000b60,in_stack_00000b58,in_stack_00000b54,
                       in_stack_00000b50,in_stack_00000b4c,in_stack_00000b80,in_stack_00000b88);
  }
  return iVar1;
}

Assistant:

static int vorbis_decode_packet(vorb *f, int *len, int *p_left, int *p_right)
{
   int mode, left_end, right_end;
   if (!vorbis_decode_initial(f, p_left, &left_end, p_right, &right_end, &mode)) return 0;
   return vorbis_decode_packet_rest(f, len, f->mode_config + mode, *p_left, left_end, *p_right, right_end, p_left);
}